

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRProgram.cc
# Opt level: O2

IRHandler * __thiscall flow::IRProgram::createHandler(IRProgram *this,string *name)

{
  pointer *__ptr;
  _Alloc_hider local_28;
  IRProgram *local_20;
  
  local_20 = this;
  std::make_unique<flow::IRHandler,std::__cxx11::string_const&,flow::IRProgram*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28,
             (IRProgram **)name);
  std::
  vector<std::unique_ptr<flow::IRHandler,std::default_delete<flow::IRHandler>>,std::allocator<std::unique_ptr<flow::IRHandler,std::default_delete<flow::IRHandler>>>>
  ::emplace_back<std::unique_ptr<flow::IRHandler,std::default_delete<flow::IRHandler>>>
            ((vector<std::unique_ptr<flow::IRHandler,std::default_delete<flow::IRHandler>>,std::allocator<std::unique_ptr<flow::IRHandler,std::default_delete<flow::IRHandler>>>>
              *)&this->handlers_,
             (unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_> *)&local_28);
  if ((long *)local_28._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_28._M_p + 8))();
  }
  return (this->handlers_).
         super__Vector_base<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<flow::IRHandler,_std::default_delete<flow::IRHandler>_>._M_t.
         super__Tuple_impl<0UL,_flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>.
         super__Head_base<0UL,_flow::IRHandler_*,_false>._M_head_impl;
}

Assistant:

IRHandler* IRProgram::createHandler(const std::string& name) {
  handlers_.emplace_back(std::make_unique<IRHandler>(name, this));
  return handlers_.back().get();
}